

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::AtomicCounterTestGroup::init
          (AtomicCounterTestGroup *this,EVP_PKEY_CTX *ctx)

{
  uint presentStagesMask;
  Context *context;
  AtomicCounterCase *pAVar1;
  AtomicCounterReferencedByCase *pAVar2;
  undefined8 *extraout_RAX;
  undefined8 *puVar3;
  uint uVar4;
  char *__rhs;
  uint presentStagesMask_00;
  long lVar5;
  deUint32 in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long local_c0;
  char *local_b8;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pAVar1 = (AtomicCounterCase *)operator_new(0x80);
  AtomicCounterCase::AtomicCounterCase
            (pAVar1,(this->super_TestCaseGroup).m_context,"resource_list","Resource list");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__AtomicCounterCase_01e53e70;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (AtomicCounterCase *)operator_new(0x80);
  AtomicCounterCase::AtomicCounterCase
            (pAVar1,(this->super_TestCaseGroup).m_context,"active_variables","Active variables");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__AtomicCounterCase_01e53f10;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (AtomicCounterCase *)operator_new(0x80);
  AtomicCounterCase::AtomicCounterCase
            (pAVar1,(this->super_TestCaseGroup).m_context,"buffer_binding","Buffer binding");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__AtomicCounterCase_01e53f60;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (AtomicCounterCase *)operator_new(0x80);
  AtomicCounterCase::AtomicCounterCase
            (pAVar1,(this->super_TestCaseGroup).m_context,"buffer_data_size","Buffer binding");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__AtomicCounterCase_01e53fb0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar2 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar2,(this->super_TestCaseGroup).m_context,"referenced_by_compute",(char *)0x0,true,
             0x20,in_stack_ffffffffffffff08);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar2,(this->super_TestCaseGroup).m_context,"referenced_by_separable_vertex",
             &DAT_00000001,true,1,in_stack_ffffffffffffff08);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar2,(this->super_TestCaseGroup).m_context,"referenced_by_separable_fragment",
             &DAT_00000001,true,2,in_stack_ffffffffffffff08);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar2,(this->super_TestCaseGroup).m_context,"referenced_by_separable_geometry",
             &DAT_00000001,true,4,in_stack_ffffffffffffff08);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar2,(this->super_TestCaseGroup).m_context,"referenced_by_separable_tess_ctrl",
             &DAT_00000001,true,8,in_stack_ffffffffffffff08);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  pAVar2 = (AtomicCounterReferencedByCase *)operator_new(0x90);
  AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
            (pAVar2,(this->super_TestCaseGroup).m_context,"referenced_by_separable_tess_eval",
             &DAT_00000001,true,0x10,in_stack_ffffffffffffff08);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
  lVar5 = 0;
  puVar3 = extraout_RAX;
  do {
    if (lVar5 == 4) {
      return (int)puVar3;
    }
    pAVar2 = (AtomicCounterReferencedByCase *)operator_new(0x90);
    context = (this->super_TestCaseGroup).m_context;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_70,&local_e0,"referenced_by_");
    local_b8 = init::pipelines[lVar5].name;
    local_c0 = lVar5;
    std::operator+(&name,&local_70,local_b8);
    presentStagesMask = init::pipelines[lVar5].flags;
    AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
              (pAVar2,context,name._M_dataplus._M_p,(char *)0x0,SUB41(presentStagesMask,0),
               presentStagesMask,in_stack_ffffffffffffff08);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_e0);
    puVar3 = &DAT_01e544b0;
    for (uVar4 = 0; uVar4 != 6; uVar4 = uVar4 + 1) {
      presentStagesMask_00 = 1 << ((byte)uVar4 & 0x1f);
      if (presentStagesMask < presentStagesMask_00) break;
      if ((presentStagesMask_00 & presentStagesMask) != 0) {
        if (uVar4 < 4) {
          __rhs = (char *)*puVar3;
        }
        else {
          __rhs = (char *)0x0;
          if (uVar4 == 4) {
            __rhs = "tess_eval";
          }
        }
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        std::operator+(&local_50,&local_90,"referenced_by_");
        std::operator+(&local_e0,&local_50,local_b8);
        std::operator+(&local_70,&local_e0,"_only_");
        std::operator+(&name,&local_70,__rhs);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        pAVar2 = (AtomicCounterReferencedByCase *)operator_new(0x90);
        AtomicCounterReferencedByCase::AtomicCounterReferencedByCase
                  (pAVar2,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,(char *)0x0,
                   SUB41(presentStagesMask,0),presentStagesMask_00,in_stack_ffffffffffffff08);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar2);
        std::__cxx11::string::~string((string *)&name);
      }
      puVar3 = puVar3 + 1;
    }
    lVar5 = local_c0 + 1;
  } while( true );
}

Assistant:

void AtomicCounterTestGroup::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	flags;
	} pipelines[] =
	{
		{
			"vertex_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT)
		},
		{
			"vertex_tess_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION)
		},
		{
			"vertex_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_GEOMETRY)
		},
		{
			"vertex_tess_geo_fragment",
			(1 << glu::SHADERTYPE_VERTEX) | (1 << glu::SHADERTYPE_FRAGMENT) | (1 << glu::SHADERTYPE_TESSELLATION_CONTROL) | (1 << glu::SHADERTYPE_TESSELLATION_EVALUATION) | (1 << glu::SHADERTYPE_GEOMETRY),
		},
	};

	// .resource_list
	addChild(new AtomicCounterResourceListCase(m_context, "resource_list", "Resource list"));

	// .active_variables
	addChild(new AtomicCounterActiveVariablesCase(m_context, "active_variables", "Active variables"));

	// .buffer_binding
	addChild(new AtomicCounterBufferBindingCase(m_context, "buffer_binding", "Buffer binding"));

	// .buffer_data_size
	addChild(new AtomicCounterBufferDataSizeCase(m_context, "buffer_data_size", "Buffer binding"));

	// .referenced_by
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_compute",				"",	false,	(1 << glu::SHADERTYPE_COMPUTE),										(1 << glu::SHADERTYPE_COMPUTE)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_vertex",		"",	true,	(1 << glu::SHADERTYPE_VERTEX),										(1 << glu::SHADERTYPE_VERTEX)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_fragment",	"",	true,	(1 << glu::SHADERTYPE_FRAGMENT),									(1 << glu::SHADERTYPE_FRAGMENT)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_geometry",	"",	true,	(1 << glu::SHADERTYPE_GEOMETRY),									(1 << glu::SHADERTYPE_GEOMETRY)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_tess_ctrl",	"",	true,	(1 << glu::SHADERTYPE_TESSELLATION_CONTROL),						(1 << glu::SHADERTYPE_TESSELLATION_CONTROL)));
	addChild(new AtomicCounterReferencedByCase(m_context, "referenced_by_separable_tess_eval",	"",	true,	(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION),						(1 << glu::SHADERTYPE_TESSELLATION_EVALUATION)));

	for (int pipelineNdx = 0; pipelineNdx < DE_LENGTH_OF_ARRAY(pipelines); ++pipelineNdx)
	{
		addChild(new AtomicCounterReferencedByCase(m_context, (std::string() + "referenced_by_" + pipelines[pipelineNdx].name).c_str(), "", false, pipelines[pipelineNdx].flags, pipelines[pipelineNdx].flags));

		for (deUint32 stageNdx = 0; stageNdx < glu::SHADERTYPE_LAST; ++stageNdx)
		{
			const deUint32 currentBit = (1u << stageNdx);
			if (currentBit > pipelines[pipelineNdx].flags)
				break;
			if (currentBit & pipelines[pipelineNdx].flags)
			{
				const char*			stageName	= (stageNdx == glu::SHADERTYPE_VERTEX)					? ("vertex")
												: (stageNdx == glu::SHADERTYPE_FRAGMENT)				? ("fragment")
												: (stageNdx == glu::SHADERTYPE_GEOMETRY)				? ("geo")
												: (stageNdx == glu::SHADERTYPE_TESSELLATION_CONTROL)	? ("tess_ctrl")
												: (stageNdx == glu::SHADERTYPE_TESSELLATION_EVALUATION)	? ("tess_eval")
												: (DE_NULL);
				const std::string	name		= std::string() + "referenced_by_" + pipelines[pipelineNdx].name + "_only_" + stageName;

				addChild(new AtomicCounterReferencedByCase(m_context, name.c_str(), "", false, pipelines[pipelineNdx].flags, currentBit));
			}
		}
	}
}